

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_CreateFromNamedFile
          (char *filename,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  FILE *file;
  ktxStream local_d8;
  KTX_header2 local_70;
  
  if (newTex == (ktxTexture2 **)0x0) {
    return KTX_INVALID_VALUE;
  }
  This = (ktxTexture2 *)malloc(0xa8);
  if (This == (ktxTexture2 *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if (filename == (char *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    file = fopen(filename,"rb");
    if (file == (FILE *)0x0) {
      kVar1 = KTX_FILE_OPEN_FAILED;
    }
    else {
      kVar1 = ktxFileStream_construct(&local_d8,(FILE *)file,true);
      if (((kVar1 == KTX_SUCCESS) &&
          (kVar1 = (*local_d8.read)(&local_d8,&local_70,0x50), kVar1 == KTX_SUCCESS)) &&
         (kVar1 = ktxTexture2_constructFromStreamAndHeader(This,&local_d8,&local_70,createFlags),
         kVar1 == KTX_SUCCESS)) {
        kVar1 = KTX_SUCCESS;
        goto LAB_001d29ba;
      }
    }
  }
  free(This);
  This = (ktxTexture2 *)0x0;
LAB_001d29ba:
  *newTex = This;
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromNamedFile(const char* const filename,
                                ktxTextureCreateFlags createFlags,
                                ktxTexture2** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromNamedFile(tex, filename, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}